

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O1

lzma_ret lzma_raw_coder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_filter *options,
                            lzma_filter_find coder_find,_Bool is_encoder)

{
  lzma_init_function p_Var1;
  bool bVar2;
  lzma_allocator *allocator_00;
  lzma_ret lVar3;
  lzma_filter_coder *plVar4;
  size_t sVar5;
  void **ppvVar6;
  size_t count;
  lzma_filter_info filters [5];
  size_t local_b8;
  lzma_allocator *local_b0;
  lzma_filter_info local_a8 [5];
  
  lVar3 = validate_chain(options,&local_b8);
  if (lVar3 == LZMA_OK) {
    local_b0 = allocator;
    if (is_encoder) {
      if (local_b8 != 0) {
        ppvVar6 = &local_a8[local_b8 - 1].options;
        lVar3 = LZMA_OK;
        sVar5 = local_b8;
        do {
          plVar4 = (*coder_find)(options->id);
          if ((plVar4 == (lzma_filter_coder *)0x0) ||
             (p_Var1 = plVar4->init, p_Var1 == (lzma_init_function)0x0)) {
            bVar2 = false;
            lVar3 = LZMA_OPTIONS_ERROR;
          }
          else {
            ((lzma_filter_info *)(ppvVar6 + -2))->id = options->id;
            ppvVar6[-1] = p_Var1;
            *ppvVar6 = options->options;
            bVar2 = true;
          }
          if (!bVar2) {
            return lVar3;
          }
          options = options + 1;
          ppvVar6 = ppvVar6 + -3;
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
    }
    else if (local_b8 != 0) {
      ppvVar6 = &local_a8[0].options;
      lVar3 = LZMA_OK;
      sVar5 = local_b8;
      do {
        plVar4 = (*coder_find)(options->id);
        if ((plVar4 == (lzma_filter_coder *)0x0) ||
           (p_Var1 = plVar4->init, p_Var1 == (lzma_init_function)0x0)) {
          bVar2 = false;
          lVar3 = LZMA_OPTIONS_ERROR;
        }
        else {
          ((lzma_filter_info *)(ppvVar6 + -2))->id = options->id;
          ppvVar6[-1] = p_Var1;
          *ppvVar6 = options->options;
          bVar2 = true;
        }
        if (!bVar2) {
          return lVar3;
        }
        ppvVar6 = ppvVar6 + 3;
        options = options + 1;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
    }
    allocator_00 = local_b0;
    local_a8[local_b8].id = 0xffffffffffffffff;
    local_a8[local_b8].init = (lzma_init_function_conflict8)0x0;
    lVar3 = lzma_next_filter_init(next,local_b0,local_a8);
    if (lVar3 != LZMA_OK) {
      lzma_next_end(next,allocator_00);
    }
  }
  return lVar3;
}

Assistant:

extern lzma_ret
lzma_raw_coder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter *options,
		lzma_filter_find coder_find, bool is_encoder)
{
	lzma_filter_info filters[LZMA_FILTERS_MAX + 1];
	size_t count;
	size_t i;
	lzma_ret ret;

	// Do some basic validation and get the number of filters.
	return_if_error(validate_chain(options, &count));

	// Set the filter functions and copy the options pointer.
	if (is_encoder) {
		for (i = 0; i < count; ++i) {
			// The order of the filters is reversed in the
			// encoder. It allows more efficient handling
			// of the uncompressed data.
			const size_t j = count - i - 1;

			const lzma_filter_coder *const fc
					= coder_find(options[i].id);
			if (fc == NULL || fc->init == NULL)
				return LZMA_OPTIONS_ERROR;

			filters[j].id = options[i].id;
			filters[j].init = fc->init;
			filters[j].options = options[i].options;
		}
	} else {
		for (i = 0; i < count; ++i) {
			const lzma_filter_coder *const fc
					= coder_find(options[i].id);
			if (fc == NULL || fc->init == NULL)
				return LZMA_OPTIONS_ERROR;

			filters[i].id = options[i].id;
			filters[i].init = fc->init;
			filters[i].options = options[i].options;
		}
	}

	// Terminate the array.
	filters[count].id = LZMA_VLI_UNKNOWN;
	filters[count].init = NULL;

	// Initialize the filters.
	ret = lzma_next_filter_init(next, allocator, filters);
	if (ret != LZMA_OK)
		lzma_next_end(next, allocator);

	return ret;
}